

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t put_uint(MIR_context_t ctx,writer_func_t writer,uint64_t u,int nb)

{
  uint uVar1;
  reduce_data *data;
  uint32_t uVar2;
  uint8_t *puVar3;
  int iVar4;
  
  iVar4 = nb;
  if (0 < nb) {
    do {
      if (writer != (writer_func_t)0x0) {
        data = ctx->io_ctx->io_reduce_data;
        uVar1 = data->buf_bound;
        if ((ulong)uVar1 < 0x40000) {
          uVar2 = uVar1 + 1;
          puVar3 = data->buf + uVar1;
        }
        else {
          _reduce_encode_buf(data);
          puVar3 = data->buf;
          uVar2 = 1;
        }
        *puVar3 = (uint8_t)u;
        data->buf_bound = uVar2;
      }
      u = u >> 8;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return (long)nb;
}

Assistant:

static size_t put_uint (MIR_context_t ctx, writer_func_t writer, uint64_t u, int nb) {
  if (writer == NULL) return 0;
  for (int n = 0; n < nb; n++) {
    put_byte (ctx, writer, u & 0xff);
    u >>= CHAR_BIT;
  }
  return nb;
}